

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O0

int ar_parse_gnu_filename_table(archive_read *a)

{
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  size_t size;
  char *p;
  ar *ar;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  lVar2 = *(long *)((long)pvVar1 + 0x28);
  for (size = *(size_t *)((long)pvVar1 + 0x20); size < (*(long *)((long)pvVar1 + 0x20) + lVar2) - 1U
      ; size = size + 1) {
    if (*(char *)size == '/') {
      pcVar3 = (char *)(size + 1);
      *(undefined1 *)size = 0;
      if (*pcVar3 != '\n') goto LAB_0018498e;
      *pcVar3 = '\0';
      size = (size_t)pcVar3;
    }
  }
  if (((size == *(long *)((long)pvVar1 + 0x20) + lVar2) || (*(char *)size == '\n')) ||
     (*(char *)size == '`')) {
    *(undefined1 *)(*(long *)((long)pvVar1 + 0x20) + lVar2 + -1) = 0;
    a_local._4_4_ = 0;
  }
  else {
LAB_0018498e:
    archive_set_error(&a->archive,0x16,"Invalid string table");
    free(*(void **)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
ar_parse_gnu_filename_table(struct archive_read *a)
{
	struct ar *ar;
	char *p;
	size_t size;

	ar = (struct ar*)(a->format->data);
	size = ar->strtab_size;

	for (p = ar->strtab; p < ar->strtab + size - 1; ++p) {
		if (*p == '/') {
			*p++ = '\0';
			if (*p != '\n')
				goto bad_string_table;
			*p = '\0';
		}
	}
	/*
	 * GNU ar always pads the table to an even size.
	 * The pad character is either '\n' or '`'.
	 */
	if (p != ar->strtab + size && *p != '\n' && *p != '`')
		goto bad_string_table;

	/* Enforce zero termination. */
	ar->strtab[size - 1] = '\0';

	return (ARCHIVE_OK);

bad_string_table:
	archive_set_error(&a->archive, EINVAL,
	    "Invalid string table");
	free(ar->strtab);
	ar->strtab = NULL;
	return (ARCHIVE_FATAL);
}